

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O1

int execute_tests(string *out_name,string *exp_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  long *plVar13;
  ulong uVar14;
  uint __val;
  ulong *puVar15;
  uint __uval_1;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  string __str;
  string exp_line;
  string out_line;
  uint __uval;
  string __str_2;
  string exp_no_comment_name;
  ifstream exp_no_comment_file;
  ifstream out_file;
  string local_5a8;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong *local_568;
  long local_560;
  ulong local_558;
  long lStack_550;
  char *local_548;
  size_t local_540;
  char local_538 [16];
  string local_528;
  ulong local_508;
  ulong *local_500;
  long local_4f8;
  ulong local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0;
  long lStack_4c8;
  ulong *local_4c0 [2];
  ulong local_4b0 [2];
  long *local_4a0;
  long local_498;
  long local_490;
  long lStack_488;
  long *local_480;
  long local_478;
  long local_470;
  long lStack_468;
  string local_460;
  long local_440 [65];
  long local_238 [65];
  
  create_file_with_removed_comments(&local_460,exp_name);
  if (local_460._M_string_length == 0) {
    __val = 0xffffd8f1;
    goto LAB_0010a6fc;
  }
  std::ifstream::ifstream(local_238,(string *)out_name,_S_in);
  std::ifstream::ifstream(local_440,(string *)&local_460,_S_in);
  bVar2 = problem_with_file_to_read((ifstream *)local_238,out_name);
  __val = 0xffffd8f1;
  if ((!bVar2) && (bVar2 = problem_with_file_to_read((ifstream *)local_440,&local_460), !bVar2)) {
    paVar1 = &local_528.field_2;
    local_528._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"executing tests...\n","");
    write_colored_text(&local_528,blue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != paVar1) {
      operator_delete(local_528._M_dataplus._M_p);
    }
    uVar14 = 0;
    local_528._M_string_length = 0;
    local_528.field_2._M_local_buf[0] = '\0';
    local_548 = local_538;
    local_540 = 0;
    local_538[0] = '\0';
    __val = 0;
    local_528._M_dataplus._M_p = (pointer)paVar1;
    do {
      do {
        uVar10 = uVar14 & 0xffffffff;
        while( true ) {
          cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(ifstream *)local_238);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_528,cVar3);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
            goto LAB_00109fc4;
          }
          cVar3 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_440,(string *)&local_548,cVar3);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) break;
          local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5a8,"You produced at least one line to much of output: ","");
          write_colored_text(&local_5a8,red);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
            operator_delete(local_5a8._M_dataplus._M_p);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_528._M_dataplus._M_p,
                              local_528._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          __val = __val + 1;
        }
        uVar18 = (uint)uVar14;
        uVar14 = (ulong)(uVar18 + 1);
      } while ((local_528._M_string_length == local_540) &&
              ((local_528._M_string_length == 0 ||
               (iVar4 = bcmp(local_528._M_dataplus._M_p,local_548,local_528._M_string_length),
               iVar4 == 0))));
      uVar17 = 1;
      if (8 < uVar18) {
        uVar10 = uVar14;
        uVar18 = 4;
        do {
          uVar17 = uVar18;
          uVar16 = (uint)uVar10;
          if (uVar16 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_00109d9f;
          }
          if (uVar16 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_00109d9f;
          }
          if (uVar16 < 10000) goto LAB_00109d9f;
          uVar10 = uVar10 / 10000;
          uVar18 = uVar17 + 4;
        } while (99999 < uVar16);
        uVar17 = uVar17 + 1;
      }
LAB_00109d9f:
      local_568 = &local_558;
      local_508 = uVar14;
      std::__cxx11::string::_M_construct((ulong)&local_568,(char)uVar17);
      uVar14 = local_508;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_568,uVar17,(uint)local_508);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x11912b)
      ;
      local_588 = &local_578;
      puVar11 = puVar7 + 2;
      paVar1 = &local_5a8.field_2;
      if ((undefined8 *)*puVar7 == puVar11) {
        local_578 = *puVar11;
        uStack_570 = puVar7[3];
      }
      else {
        local_578 = *puVar11;
        local_588 = (undefined8 *)*puVar7;
      }
      local_580 = puVar7[1];
      *puVar7 = puVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_588);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_5a8.field_2._M_allocated_capacity = *psVar12;
        local_5a8.field_2._8_8_ = plVar8[3];
        local_5a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_5a8.field_2._M_allocated_capacity = *psVar12;
        local_5a8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_5a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      write_colored_text(&local_5a8,red);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p);
      }
      if (local_588 != &local_578) {
        operator_delete(local_588);
      }
      if (local_568 != &local_558) {
        operator_delete(local_568);
      }
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Expected: ","");
      write_colored_text(&local_5a8,yellow);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_548,local_540);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Your output: ","");
      write_colored_text(&local_5a8,cyan);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_528._M_dataplus._M_p,
                          local_528._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      __val = __val + 1;
    } while( true );
  }
  goto LAB_0010a6e2;
LAB_00109fc4:
  cVar3 = std::ios::widen((char)*(undefined8 *)(local_440[0] + -0x18) + (char)local_440);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_440,(string *)&local_548,cVar3);
  uVar18 = (uint)uVar10;
  if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0010a1c2;
  uVar16 = uVar18 + 1;
  uVar17 = 1;
  if (8 < uVar18) {
    uVar18 = uVar16;
    uVar9 = 4;
    do {
      uVar17 = uVar9;
      if (uVar18 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_0010a058;
      }
      if (uVar18 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_0010a058;
      }
      if (uVar18 < 10000) goto LAB_0010a058;
      bVar2 = 99999 < uVar18;
      uVar18 = uVar18 / 10000;
      uVar9 = uVar17 + 4;
    } while (bVar2);
    uVar17 = uVar17 + 1;
  }
LAB_0010a058:
  local_568 = &local_558;
  std::__cxx11::string::_M_construct((ulong)&local_568,(char)uVar17);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_568,uVar17,uVar16);
  puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x119187);
  puVar11 = puVar7 + 2;
  if ((undefined8 *)*puVar7 == puVar11) {
    local_578 = *puVar11;
    uStack_570 = puVar7[3];
    local_588 = &local_578;
  }
  else {
    local_578 = *puVar11;
    local_588 = (undefined8 *)*puVar7;
  }
  local_580 = puVar7[1];
  *puVar7 = puVar11;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_588);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_5a8.field_2._M_allocated_capacity = *psVar12;
    local_5a8.field_2._8_8_ = puVar7[3];
  }
  else {
    local_5a8.field_2._M_allocated_capacity = *psVar12;
    local_5a8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_5a8._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  write_colored_text(&local_5a8,red);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_548,local_540);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  __val = __val + 1;
  uVar10 = (ulong)uVar16;
  goto LAB_00109fc4;
LAB_0010a1c2:
  uVar17 = 1;
  if ((int)__val < 1) {
    if (9 < uVar18) {
      uVar16 = 4;
      do {
        uVar17 = uVar16;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0010a72d;
        }
        if (uVar9 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0010a72d;
        }
        if (uVar9 < 10000) goto LAB_0010a72d;
        uVar10 = uVar10 / 10000;
        uVar16 = uVar17 + 4;
      } while (99999 < uVar9);
      uVar17 = uVar17 + 1;
    }
LAB_0010a72d:
    local_568 = &local_558;
    std::__cxx11::string::_M_construct((ulong)&local_568,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_568,uVar17,uVar18);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_568,0,(char *)0x0,0x1191f3);
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_578 = *puVar11;
      uStack_570 = puVar7[3];
      local_588 = &local_578;
    }
    else {
      local_578 = *puVar11;
      local_588 = (undefined8 *)*puVar7;
    }
    local_580 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_588);
    psVar12 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8.field_2._8_8_ = puVar7[3];
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_5a8._M_string_length = puVar7[1];
    *puVar7 = psVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    write_colored_text(&local_5a8,green);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if (local_588 != &local_578) {
      operator_delete(local_588);
    }
    puVar15 = local_568;
    if (local_568 != &local_558) goto LAB_0010a680;
  }
  else {
    if (9 < __val) {
      uVar14 = (ulong)__val;
      uVar16 = 4;
      do {
        uVar17 = uVar16;
        uVar9 = (uint)uVar14;
        if (uVar9 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0010a27c;
        }
        if (uVar9 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0010a27c;
        }
        if (uVar9 < 10000) goto LAB_0010a27c;
        uVar14 = uVar14 / 10000;
        uVar16 = uVar17 + 4;
      } while (99999 < uVar9);
      uVar17 = uVar17 + 1;
    }
LAB_0010a27c:
    local_4c0[0] = local_4b0;
    std::__cxx11::string::_M_construct((ulong)local_4c0,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_4c0[0],uVar17,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_4c0,0,(char *)0x0,0x1191b0);
    local_4e0 = &local_4d0;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_4d0 = *plVar13;
      lStack_4c8 = plVar8[3];
    }
    else {
      local_4d0 = *plVar13;
      local_4e0 = (long *)*plVar8;
    }
    local_4d8 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4e0);
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_490 = *plVar13;
      lStack_488 = plVar8[3];
      local_4a0 = &local_490;
    }
    else {
      local_490 = *plVar13;
      local_4a0 = (long *)*plVar8;
    }
    local_498 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_470 = *plVar13;
      lStack_468 = plVar8[3];
      local_480 = &local_470;
    }
    else {
      local_470 = *plVar13;
      local_480 = (long *)*plVar8;
    }
    local_478 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_480);
    puVar15 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar15) {
      local_558 = *puVar15;
      lStack_550 = plVar8[3];
      local_568 = &local_558;
    }
    else {
      local_558 = *puVar15;
      local_568 = (ulong *)*plVar8;
    }
    local_560 = plVar8[1];
    *plVar8 = (long)puVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    uVar17 = 1;
    if (9 < uVar18) {
      uVar16 = 4;
      do {
        uVar17 = uVar16;
        uVar9 = (uint)uVar10;
        if (uVar9 < 100) {
          uVar17 = uVar17 - 2;
          goto LAB_0010a499;
        }
        if (uVar9 < 1000) {
          uVar17 = uVar17 - 1;
          goto LAB_0010a499;
        }
        if (uVar9 < 10000) goto LAB_0010a499;
        uVar10 = uVar10 / 10000;
        uVar16 = uVar17 + 4;
      } while (99999 < uVar9);
      uVar17 = uVar17 + 1;
    }
LAB_0010a499:
    local_500 = local_4f0;
    std::__cxx11::string::_M_construct((ulong)&local_500,(char)uVar17);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_500,uVar17,uVar18);
    uVar14 = 0xf;
    if (local_568 != &local_558) {
      uVar14 = local_558;
    }
    if (uVar14 < (ulong)(local_4f8 + local_560)) {
      uVar14 = 0xf;
      if (local_500 != local_4f0) {
        uVar14 = local_4f0[0];
      }
      if (uVar14 < (ulong)(local_4f8 + local_560)) goto LAB_0010a51b;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_568);
    }
    else {
LAB_0010a51b:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_568,(ulong)local_500);
    }
    puVar11 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar11) {
      local_578 = *puVar11;
      uStack_570 = puVar7[3];
      local_588 = &local_578;
    }
    else {
      local_578 = *puVar11;
      local_588 = (undefined8 *)*puVar7;
    }
    local_580 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)puVar11 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_588);
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    psVar12 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_5a8.field_2._M_allocated_capacity = *psVar12;
      local_5a8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_5a8._M_string_length = puVar7[1];
    *puVar7 = psVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    write_colored_text(&local_5a8,magenta);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
    if (local_588 != &local_578) {
      operator_delete(local_588);
    }
    if (local_500 != local_4f0) {
      operator_delete(local_500);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568);
    }
    if (local_480 != &local_470) {
      operator_delete(local_480);
    }
    if (local_4a0 != &local_490) {
      operator_delete(local_4a0);
    }
    if (local_4e0 != &local_4d0) {
      operator_delete(local_4e0);
    }
    puVar15 = local_4c0[0];
    if (local_4c0[0] != local_4b0) {
LAB_0010a680:
      operator_delete(puVar15);
    }
  }
  std::ifstream::close();
  remove_a_file(&local_460);
  std::ifstream::close();
  std::ifstream::close();
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
LAB_0010a6e2:
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
LAB_0010a6fc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  return __val;
}

Assistant:

int execute_tests(const string &out_name, const string &exp_name) {
    // Open 'out_name' and 'exp_name' for 'r'-access:
    // see https://www.tutorialspoint.com/cplusplus/cpp_files_streams.htm
    // ifstream ... : represents input file stream (for reading from files)
    // ofstream ... : represents output file stream (for creating and writing to files)
    // For comparing, you only need reading:


    // Creating file with removed comments in exp_file:
    string exp_no_comment_name = create_file_with_removed_comments(exp_name);
    if (exp_no_comment_name.empty()) return -9999;


    // Open files for read-access
    ifstream out_file(out_name);
    ifstream exp_no_comment_file(exp_no_comment_name);
    if (problem_with_file_to_read(out_file, out_name)) return -9999;
    if (problem_with_file_to_read(exp_no_comment_file, exp_no_comment_name)) return -9999;


    // Run actual tests: do string-comparison line by line
    write_colored_text("executing tests...\n", blue);
    int line_nr = 0, error_count = 0;
    string out_line, exp_line;

    while (getline(out_file, out_line)) {
        if (getline(exp_no_comment_file, exp_line)) {
            line_nr++;
            /*
             * NOTE: I wanted to compare the two string as described in
             * various online resources, such as https://www.geeksforgeeks.org/stdstringcompare-in-c/
             * With:
             *      if (out_line.compare(exp_line) == 0)
             * But CLion showed "Clang-Tidy: Do not use 'compare' to test equality of strings; use the string
             *      equality operator instead"
             *
             * It seems the above construct would be great to see if a string is shorter or longer than the other:
             *      int difference = out_line.compare(exp_line);
             *
             * But here, I only want to know if they are the same.
             * -> after automatic refactoring
             */
            if (out_line != exp_line) {
                write_colored_text("Error: Line " + to_string(line_nr) + ":\t");
                write_colored_text("Expected: ", yellow);
                cout << exp_line << "\t";
                write_colored_text("Your output: ", cyan);
                cout << out_line << endl;
                error_count++;
            }
        } else {
            write_colored_text("You produced at least one line to much of output: ");
            cout << out_line << endl;
            error_count++;
        }
    }

    // Check, if 'expected' has more lines than 'out':
    while (getline(exp_no_comment_file, exp_line)) {
        line_nr++;
        write_colored_text("You failed to produce expected line " + to_string(line_nr) + ":  ");
        cout << exp_line << endl;
        error_count++;
    }

    if (error_count > 0) {
        write_colored_text(
                "You produced " + to_string(error_count) + " wrong line" + (error_count == 1 ? "" : "s") +
                " of totally " + to_string(line_nr) + " lines of expected output!\n",
                magenta);
    } else {
        write_colored_text("Yes, no errors, all " + to_string(line_nr) + " lines of output are correct!\n",
                           green);
    }

    // Remove the file without comments
    exp_no_comment_file.close();
    remove_a_file(exp_no_comment_name);

    out_file.close();
    exp_no_comment_file.close();

    return error_count;
}